

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O1

bool_t MATROSKA_TrackSetCompressionHeader
                 (matroska_trackentry *TrackEntry,uint8_t *Header,size_t HeaderSize,int ForProfile)

{
  bool_t bVar1;
  ebml_context *peVar2;
  ebml_element *p;
  ebml_master *peVar3;
  ebml_integer *Element;
  ebml_binary *Element_00;
  
  bVar1 = Node_IsPartOf(TrackEntry,0x45544b4d);
  if (bVar1 != 0) {
    peVar2 = MATROSKA_getContextContentEncodings();
    p = EBML_MasterFindFirstElt(&TrackEntry->Base,peVar2,0,0,0);
    if (p != (ebml_element *)0x0) {
      NodeDelete((node *)p);
    }
    if (HeaderSize != 0 && Header != (uint8_t *)0x0) {
      peVar2 = MATROSKA_getContextContentEncodings();
      peVar3 = (ebml_master *)EBML_MasterFindFirstElt(&TrackEntry->Base,peVar2,1,1,ForProfile);
      peVar2 = MATROSKA_getContextContentEncoding();
      peVar3 = (ebml_master *)EBML_MasterFindFirstElt(peVar3,peVar2,1,1,ForProfile);
      peVar2 = MATROSKA_getContextContentCompression();
      peVar3 = (ebml_master *)EBML_MasterFindFirstElt(peVar3,peVar2,1,1,ForProfile);
      peVar2 = MATROSKA_getContextContentCompAlgo();
      Element = (ebml_integer *)EBML_MasterFindFirstElt(peVar3,peVar2,1,1,ForProfile);
      EBML_IntegerSetValue(Element,3);
      peVar2 = MATROSKA_getContextContentCompSettings();
      Element_00 = (ebml_binary *)EBML_MasterFindFirstElt(peVar3,peVar2,1,1,ForProfile);
      EBML_BinarySetData(Element_00,Header,HeaderSize);
    }
    return (ulong)(p != (ebml_element *)0x0);
  }
  __assert_fail("Node_IsPartOf(TrackEntry, MATROSKA_TRACKENTRY_CLASS)",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                ,0x956,
                "bool_t MATROSKA_TrackSetCompressionHeader(matroska_trackentry *, const uint8_t *, size_t, int)"
               );
}

Assistant:

bool_t MATROSKA_TrackSetCompressionHeader(matroska_trackentry *TrackEntry, const uint8_t *Header, size_t HeaderSize, int ForProfile)
{
    bool_t HadEncoding;
    ebml_element *Encodings, *Elt, *Elt2;
    assert(Node_IsPartOf(TrackEntry, MATROSKA_TRACKENTRY_CLASS));
    // remove the previous compression and the new optimized one
    Encodings = EBML_MasterFindChild(TrackEntry,MATROSKA_getContextContentEncodings());
    HadEncoding = Encodings!=NULL;
    if (Encodings!=NULL)
        NodeDelete((node*)Encodings);

    if (Header && HeaderSize)
    {
        Encodings = EBML_MasterGetChild((ebml_master*)TrackEntry,MATROSKA_getContextContentEncodings(), ForProfile);
        Elt2 = EBML_MasterGetChild((ebml_master*)Encodings,MATROSKA_getContextContentEncoding(), ForProfile);

        Elt =  EBML_MasterGetChild((ebml_master*)Elt2,MATROSKA_getContextContentCompression(), ForProfile);
        Elt2 = EBML_MasterGetChild((ebml_master*)Elt,MATROSKA_getContextContentCompAlgo(), ForProfile);
        EBML_IntegerSetValue((ebml_integer*)Elt2, MATROSKA_TRACK_ENCODING_COMP_HEADERSTRIP);
        Elt2 = EBML_MasterGetChild((ebml_master*)Elt,MATROSKA_getContextContentCompSettings(), ForProfile);
        EBML_BinarySetData((ebml_binary*)Elt2, Header, HeaderSize);
    }
    return HadEncoding;
}